

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_neon_subl(TCGContext_conflict1 *tcg_ctx,int size)

{
  TCGv_i64 ret;
  uintptr_t o;
  code *func;
  TCGTemp *local_18;
  TCGv_i64 local_10;
  
  ret = tcg_ctx->cpu_V0;
  if (size != 2) {
    local_18 = (TCGTemp *)(ret + (long)tcg_ctx);
    if (size == 1) {
      func = helper_neon_subl_u32_aarch64;
    }
    else {
      func = helper_neon_subl_u16_aarch64;
    }
    local_10 = tcg_ctx->cpu_V1 + (long)tcg_ctx;
    tcg_gen_callN_aarch64(tcg_ctx,func,local_18,2,&local_18);
    return;
  }
  tcg_gen_sub_i64(tcg_ctx,ret,ret,tcg_ctx->cpu_V1);
  return;
}

Assistant:

static inline void gen_neon_subl(TCGContext *tcg_ctx, int size)
{
    switch (size) {
    case 0: gen_helper_neon_subl_u16(tcg_ctx, CPU_V001); break;
    case 1: gen_helper_neon_subl_u32(tcg_ctx, CPU_V001); break;
    case 2: tcg_gen_sub_i64(tcg_ctx, CPU_V001); break;
    default: abort();
    }
}